

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent *indent)

{
  cmInstallExportGenerator *this_00;
  ostream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  string installedDir;
  string installedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  int local_84;
  string local_80;
  cmInstallExportGenerator *local_60;
  string local_58;
  string *local_38;
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"$ENV{DESTDIR}","");
  local_38 = &(this->super_cmInstallGenerator).Destination;
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&local_80,&this->super_cmInstallGenerator,local_38);
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_a8);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)(this->FileName)._M_dataplus._M_p);
  if (0 < indent->Level) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < indent->Level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  iVar4 = indent->Level;
  iVar2 = iVar4 + 2;
  local_60 = this;
  if (-2 < iVar4) {
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"file(DIFFERENT EXPORT_FILE_CHANGED FILES\n",0x29);
  if (-2 < iVar4) {
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"     \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
  if (-2 < iVar4) {
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"     \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(local_60->MainImportFile)._M_dataplus._M_p,
                      (local_60->MainImportFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  if (-2 < iVar4) {
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXPORT_FILE_CHANGED)\n",0x18);
  local_84 = iVar4 + 4;
  if (-4 < iVar4) {
    iVar3 = 1;
    if (1 < local_84) {
      iVar3 = local_84;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(GLOB OLD_CONFIG_FILES \"",0x1c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_(&local_58,local_60->EFGen);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (-4 < iVar4) {
    iVar3 = 1;
    if (1 < local_84) {
      iVar3 = local_84;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(OLD_CONFIG_FILES)\n",0x15);
  iVar3 = iVar4 + 6;
  if (-6 < iVar4) {
    iVar5 = 1;
    if (1 < iVar3) {
      iVar5 = iVar3;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"message(STATUS \"Old export file \\\"",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n",0x3e);
  if (-6 < iVar4) {
    iVar5 = 1;
    if (1 < iVar3) {
      iVar5 = iVar3;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(REMOVE ${OLD_CONFIG_FILES})\n",0x21);
  if (-4 < iVar4) {
    iVar3 = 1;
    if (1 < local_84) {
      iVar3 = local_84;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if (-2 < iVar4) {
    iVar4 = 1;
    if (1 < iVar2) {
      iVar4 = iVar2;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if (0 < indent->Level) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < indent->Level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  this_00 = local_60;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58,&local_60->MainImportFile);
  cmInstallGenerator::AddInstallRule
            (&this_00->super_cmInstallGenerator,os,local_38,cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,false,(this_00->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             (char *)0x0,indent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent const& indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = "$ENV{DESTDIR}";
  installedDir += this->ConvertToAbsoluteDestination(this->Destination);
  installedDir += "/";
  std::string installedFile = installedDir;
  installedFile += this->FileName;
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  os << indentN << "file(DIFFERENT EXPORT_FILE_CHANGED FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(EXPORT_FILE_CHANGED)\n";
  os << indentNN << "file(GLOB OLD_CONFIG_FILES \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(OLD_CONFIG_FILES)\n";
  os << indentNNN << "message(STATUS \"Old export file \\\"" << installedFile
     << "\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n";
  os << indentNNN << "file(REMOVE ${OLD_CONFIG_FILES})\n";
  os << indentNN << "endif()\n";
  os << indentN << "endif()\n";
  os << indent << "endif()\n";

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination,
                       cmInstallType_FILES, files, false,
                       this->FilePermissions.c_str(), 0, 0, 0, indent);
}